

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O0

void __thiscall dtc::text_input_buffer::skip_spaces(text_input_buffer *this)

{
  bool bVar1;
  bool local_22;
  char local_11;
  bool last_nl;
  char c;
  text_input_buffer *this_local;
  
  bVar1 = finished(this);
  if (!bVar1) {
    local_11 = operator*(this);
    local_22 = false;
    while( true ) {
      bVar1 = true;
      if ((((local_11 != ' ') && (bVar1 = true, local_11 != '\t')) &&
          (bVar1 = true, local_11 != '\n')) &&
         ((bVar1 = true, local_11 != '\f' && (bVar1 = true, local_11 != '\v')))) {
        bVar1 = local_11 == '\r';
      }
      if (!bVar1) break;
      local_22 = local_11 == '\n' || local_11 == '\r';
      operator++(this);
      bVar1 = finished(this);
      if (bVar1) {
        local_11 = '\0';
      }
      else {
        local_11 = operator*(this);
      }
    }
    if ((local_11 == '#') && ((this->cursor == 0 || (local_22)))) {
      skip_to(this,'\n');
      skip_spaces(this);
    }
    bVar1 = consume(this,"/include/");
    if (bVar1) {
      handle_include(this);
      skip_spaces(this);
    }
  }
  return;
}

Assistant:

void
text_input_buffer::skip_spaces()
{
	if (finished()) { return; }
	char c = *(*this);
	bool last_nl = false;
	while ((c == ' ') || (c == '\t') || (c == '\n') || (c == '\f')
	       || (c == '\v') || (c == '\r'))
	{
		last_nl = ((c == '\n') || (c == '\r'));
		++(*this);
		if (finished())
		{
			c = '\0';
		}
		else
		{
			c = *(*this);
		}
	}
	// Skip C preprocessor leftovers
	if ((c == '#') && ((cursor == 0) || last_nl))
	{
		skip_to('\n');
		skip_spaces();
	}
	if (consume("/include/"))
	{
		handle_include();
		skip_spaces();
	}
}